

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool __thiscall Analyzer::nameLooksLikeFunctionMustReturnResult(Analyzer *this,char *name)

{
  bool bVar1;
  char *pcVar2;
  char *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  char *in_stack_00000018;
  bool nameInList;
  Analyzer *in_stack_ffffffffffffffc8;
  bool local_29;
  bool local_19;
  bool local_1;
  
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    local_1 = false;
  }
  else {
    bVar1 = nameLooksLikeResultMustBeBoolean(in_stack_ffffffffffffffc8,(char *)0x152c93);
    local_29 = true;
    if (!bVar1) {
      local_29 = settings::has_prefix(in_stack_00000018,in_stack_00000010);
    }
    local_19 = local_29;
    if ((local_29 == false) &&
       (((pcVar2 = strstr(in_RSI,"_ctor"), pcVar2 != (char *)0x0 ||
         (pcVar2 = strstr(in_RSI,"Ctor"), pcVar2 != (char *)0x0)) &&
        (pcVar2 = strstr(in_RSI,"set"), pcVar2 != in_RSI)))) {
      local_19 = true;
    }
    local_1 = local_19;
  }
  return local_1;
}

Assistant:

bool nameLooksLikeFunctionMustReturnResult(const char * name)
  {
    if (!name || !name[0])
      return false;

    bool nameInList = nameLooksLikeResultMustBeBoolean(name) ||
      settings::has_prefix(name, settings::function_should_return_something_prefix);

    if (!nameInList)
      if ((strstr(name, "_ctor") || strstr(name, "Ctor")) && strstr(name, "set") != name)
        nameInList = true;

    return nameInList;
  }